

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MessageOptions::MessageOptions(MessageOptions *this)

{
  undefined8 *in_RDI;
  ExtensionSet *in_stack_00000020;
  Arena *in_stack_ffffffffffffffb8;
  Message *in_stack_ffffffffffffffc0;
  MessageOptions *this_00;
  
  Message::Message(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__MessageOptions_00958ab0;
  internal::ExtensionSet::ExtensionSet(in_stack_00000020);
  this_00 = (MessageOptions *)(in_RDI + 4);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)this_00,in_stack_ffffffffffffffb8);
  memset(in_RDI + 5,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x51a4f7);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)0x51a509);
  SharedCtor(this_00);
  return;
}

Assistant:

MessageOptions::MessageOptions()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.MessageOptions)
}